

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void string_set(char **out,char *in)

{
  uint uVar1;
  size_t sVar2;
  char *in_RSI;
  long *in_RDI;
  size_t i;
  size_t insize;
  size_t in_stack_ffffffffffffffd8;
  char **in_stack_ffffffffffffffe0;
  size_t sVar3;
  
  sVar2 = strlen(in_RSI);
  uVar1 = string_resize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (uVar1 != 0) {
    for (sVar3 = 0; sVar3 != sVar2; sVar3 = sVar3 + 1) {
      *(char *)(*in_RDI + sVar3) = in_RSI[sVar3];
    }
  }
  return;
}

Assistant:

static void string_set(char** out, const char* in)
{
	size_t insize = strlen(in), i;
	if (string_resize(out, insize))
	{
		for (i = 0; i != insize; ++i)
		{
			(*out)[i] = in[i];
		}
	}
}